

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistancePointTarget::VisitContainingShapes
          (S2MinDistancePointTarget *this,S2ShapeIndex *index,ShapeVisitor *visitor)

{
  bool bVar1;
  anon_class_16_2_e9fd571b local_70;
  ShapeVisitor_conflict local_60;
  S2ContainsPointQueryOptions local_3c;
  S2ContainsPointQuery<S2ShapeIndex> local_38;
  ShapeVisitor *local_20;
  ShapeVisitor *visitor_local;
  S2ShapeIndex *index_local;
  S2MinDistancePointTarget *this_local;
  
  local_20 = visitor;
  visitor_local = (ShapeVisitor *)index;
  index_local = (S2ShapeIndex *)this;
  S2ContainsPointQueryOptions::S2ContainsPointQueryOptions(&local_3c);
  MakeS2ContainsPointQuery<S2ShapeIndex>(&local_38,index,&local_3c);
  local_70.visitor = local_20;
  local_70.this = this;
  std::function<bool(S2Shape*)>::
  function<S2MinDistancePointTarget::VisitContainingShapes(S2ShapeIndex_const&,std::function<bool(S2Shape*,Vector3<double>const&)>const&)::__0,void>
            ((function<bool(S2Shape*)> *)&local_60,&local_70);
  bVar1 = S2ContainsPointQuery<S2ShapeIndex>::VisitContainingShapes
                    (&local_38,&this->point_,&local_60);
  std::function<bool_(S2Shape_*)>::~function(&local_60);
  S2ContainsPointQuery<S2ShapeIndex>::~S2ContainsPointQuery(&local_38);
  return bVar1;
}

Assistant:

bool S2MinDistancePointTarget::VisitContainingShapes(
    const S2ShapeIndex& index, const ShapeVisitor& visitor) {
  return MakeS2ContainsPointQuery(&index).VisitContainingShapes(
      point_, [this, &visitor](S2Shape* shape) {
        return visitor(shape, point_);
      });
}